

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

double __thiscall crnlib::symbol_histogram::calc_entropy(symbol_histogram *this)

{
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = (this->m_hist).m_size;
  uVar2 = (ulong)uVar1;
  if (uVar2 == 0) {
    dVar7 = 0.0;
  }
  else {
    dVar5 = 0.0;
    uVar4 = 0;
    do {
      dVar5 = dVar5 + (double)(this->m_hist).m_p[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    dVar7 = 0.0;
    if (((dVar5 != 0.0) || (NAN(dVar5))) && (uVar1 != 0)) {
      puVar3 = (this->m_hist).m_p;
      dVar7 = 0.0;
      uVar4 = 0;
      do {
        if (puVar3[uVar4] != 0) {
          dVar6 = log((double)puVar3[uVar4] * (1.0 / dVar5));
          puVar3 = (this->m_hist).m_p;
          dVar7 = dVar7 + (double)puVar3[uVar4] * dVar6 * -1.4426950216293335;
          uVar2 = (ulong)(this->m_hist).m_size;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
    }
  }
  return dVar7;
}

Assistant:

double symbol_histogram::calc_entropy() const {
  double total = 0.0f;
  for (uint i = 0; i < m_hist.size(); i++)
    total += m_hist[i];
  if (total == 0.0f)
    return 0.0f;

  double entropy = 0.0f;
  double neg_inv_log2 = -1.0f / log(2.0f);
  double inv_total = 1.0f / total;
  for (uint i = 0; i < m_hist.size(); i++) {
    if (m_hist[i]) {
      double bits = log(m_hist[i] * inv_total) * neg_inv_log2;
      entropy += bits * m_hist[i];
    }
  }

  return entropy;
}